

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::ParameterizedTestCaseInfo<DriverTest>::AddTestPattern
          (ParameterizedTestCaseInfo<DriverTest> *this,char *test_case_name,char *test_base_name,
          TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *meta_factory)

{
  TestInfo *this_00;
  linked_ptr<testing::internal::ParameterizedTestCaseInfo<DriverTest>::TestInfo> local_38;
  
  this_00 = (TestInfo *)operator_new(0x48);
  TestInfo::TestInfo(this_00,test_case_name,test_base_name,meta_factory);
  local_38.link_.next_ = &local_38.link_;
  local_38.value_ = this_00;
  std::
  vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<DriverTest>::TestInfo>,std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<DriverTest>::TestInfo>>>
  ::
  emplace_back<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<DriverTest>::TestInfo>>
            ((vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<DriverTest>::TestInfo>,std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<DriverTest>::TestInfo>>>
              *)&this->tests_,&local_38);
  linked_ptr<testing::internal::ParameterizedTestCaseInfo<DriverTest>::TestInfo>::depart(&local_38);
  return;
}

Assistant:

void AddTestPattern(const char* test_case_name,
                      const char* test_base_name,
                      TestMetaFactoryBase<ParamType>* meta_factory) {
    tests_.push_back(linked_ptr<TestInfo>(new TestInfo(test_case_name,
                                                       test_base_name,
                                                       meta_factory)));
  }